

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsKeyReleased(ImGuiKey key,ImGuiID owner_id)

{
  bool bVar1;
  ImGuiKeyData *pIVar2;
  
  pIVar2 = GetKeyData(key);
  if ((0.0 < pIVar2->DownDurationPrev || pIVar2->DownDurationPrev == 0.0) && (pIVar2->Down == false)
     ) {
    bVar1 = TestKeyOwner(key,owner_id);
    return bVar1;
  }
  return false;
}

Assistant:

bool ImGui::IsKeyReleased(ImGuiKey key, ImGuiID owner_id)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (key_data->DownDurationPrev < 0.0f || key_data->Down)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}